

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

void nn_req_in(nn_sockbase *self,nn_pipe *pipe)

{
  nn_msg *msg;
  int iVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint8_t *buf;
  
  nn_xreq_in(self,pipe);
  msg = (nn_msg *)(self + 0x3f);
  do {
    iVar1 = nn_xreq_recv(self,msg);
    if (iVar1 != 0) {
      if (iVar1 == -0xb) {
        return;
      }
      nn_req_in_cold_1();
    }
    if (((9 < *(uint *)&self[0x37].sock) ||
        ((0x206U >> (*(uint *)&self[0x37].sock & 0x1f) & 1) == 0)) &&
       (sVar3 = nn_chunkref_size((nn_chunkref *)msg), sVar3 == 4)) {
      buf = (uint8_t *)nn_chunkref_data((nn_chunkref *)msg);
      uVar2 = nn_getl(buf);
      if (((int)uVar2 < 0) && (uVar2 == (*(uint *)&self[0x38].sock | 0x80000000))) {
        nn_chunkref_term((nn_chunkref *)msg);
        nn_chunkref_init((nn_chunkref *)msg,0);
        if (*(int *)&self[0x37].sock != 4) {
          return;
        }
        nn_fsm_action((nn_fsm *)(self + 0x32),2);
        return;
      }
    }
    nn_msg_term(msg);
  } while( true );
}

Assistant:

void nn_req_in (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    int rc;
    struct nn_req *req;
    uint32_t reqid;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  Pass the pipe to the raw REQ socket. */
    nn_xreq_in (&req->xreq.sockbase, pipe);

    while (1) {

        /*  Get new reply. */
        rc = nn_xreq_recv (&req->xreq.sockbase, &req->task.reply);
        if (nn_slow (rc == -EAGAIN))
            return;
        errnum_assert (rc == 0, -rc);

        /*  No request was sent. Getting a reply doesn't make sense. */
        if (nn_slow (!nn_req_inprogress (req))) {
            nn_msg_term (&req->task.reply);
            continue;
        }

        /*  Ignore malformed replies. */
        if (nn_slow (nn_chunkref_size (&req->task.reply.sphdr) !=
              sizeof (uint32_t))) {
            nn_msg_term (&req->task.reply);
            continue;
        }

        /*  Ignore replies with incorrect request IDs. */
        reqid = nn_getl (nn_chunkref_data (&req->task.reply.sphdr));
        if (nn_slow (!(reqid & 0x80000000))) {
            nn_msg_term (&req->task.reply);
            continue;
        }
        if (nn_slow (reqid != (req->task.id | 0x80000000))) {
            nn_msg_term (&req->task.reply);
            continue;
        }

        /*  Trim the request ID. */
        nn_chunkref_term (&req->task.reply.sphdr);
        nn_chunkref_init (&req->task.reply.sphdr, 0);

        /*  TODO: Deallocate the request here? */

        /*  Notify the state machine. */
        if (req->state == NN_REQ_STATE_ACTIVE)
            nn_fsm_action (&req->fsm, NN_REQ_ACTION_IN);

        return;
    }
}